

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptLoader.cpp
# Opt level: O2

ICommand * loadCommand(Stream *stream)

{
  uint uVar1;
  ScriptBlock *this;
  runtime_error *this_00;
  
  uVar1 = (*stream->_vptr_Stream[1])();
  switch(uVar1 & 0xff) {
  case 0:
    this = (ScriptBlock *)operator_new(0x20);
    CmdLogicCompound::CmdLogicCompound((CmdLogicCompound *)this,stream);
    break;
  case 1:
    this = (ScriptBlock *)operator_new(0x20);
    CmdLogic::CmdLogic((CmdLogic *)this,stream);
    break;
  case 2:
    this = (ScriptBlock *)operator_new(0x10);
    CmdReturn::CmdReturn((CmdReturn *)this,stream);
    break;
  case 3:
    this = (ScriptBlock *)operator_new(0x28);
    CmdIf::CmdIf((CmdIf *)this,stream);
    break;
  case 4:
    this = (ScriptBlock *)operator_new(0x10);
    CmdElse::CmdElse((CmdElse *)this,stream);
    break;
  case 5:
    this = (ScriptBlock *)operator_new(0x18);
    CmdElseIf::CmdElseIf((CmdElseIf *)this,stream);
    break;
  case 6:
    this = (ScriptBlock *)operator_new(0x28);
    CmdFor::CmdFor((CmdFor *)this,stream);
    break;
  case 7:
    this = (ScriptBlock *)operator_new(0x18);
    CmdWhile::CmdWhile((CmdWhile *)this,stream);
    break;
  case 8:
    this = (ScriptBlock *)operator_new(0x28);
    ScriptBlock::ScriptBlock(this,stream);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Not supported command type in ScriptLoader::loadCommand!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 10:
    this = (ScriptBlock *)operator_new(8);
    CmdEmpty::CmdEmpty((CmdEmpty *)this,stream);
    break;
  case 0xb:
    this = (ScriptBlock *)operator_new(0x18);
    CmdAssign::CmdAssign((CmdAssign *)this,stream);
    break;
  case 0xd:
    this = (ScriptBlock *)operator_new(0x18);
    CmdUnary::CmdUnary((CmdUnary *)this,stream);
    break;
  case 0xe:
    this = (ScriptBlock *)operator_new(0x20);
    CmdMath::CmdMath((CmdMath *)this,stream);
    break;
  case 0xf:
    this = (ScriptBlock *)operator_new(0x10);
    CmdNumeric::CmdNumeric((CmdNumeric *)this,stream);
    break;
  case 0x12:
    this = (ScriptBlock *)operator_new(0x10);
    CmdBool::CmdBool((CmdBool *)this,stream);
    break;
  case 0x13:
    this = (ScriptBlock *)operator_new(0x10);
    CmdVariable::CmdVariable((CmdVariable *)this,stream);
    break;
  case 0x15:
    this = (ScriptBlock *)operator_new(0x20);
    CmdGlobalFunction::CmdGlobalFunction((CmdGlobalFunction *)this,stream);
  }
  return &this->super_ICommand;
}

Assistant:

ICommand* loadCommand(Stream* stream) {
	CommandType type = static_cast<CommandType>(stream->readByte());
	switch (type) {
		case CT_SCRIPT_BLOCK:
			return new ScriptBlock(stream);
		case CT_ASSIGN:
			return new CmdAssign(stream);
		case CT_BOOL:
			return new CmdBool(stream);
		case CT_ELSE:
			return new CmdElse(stream);
		case CT_ELSE_IF:
			return new CmdElseIf(stream);
		case CT_EMPTY:
			return new CmdEmpty(stream);
		case CT_FOR:
			return new CmdFor(stream);
		case CT_IF:
			return new CmdIf(stream);
		case CT_LOGIC:
			return new CmdLogic(stream);
		case CT_LOGIC_COMPOUND:
			return new CmdLogicCompound(stream);
		case CT_MATH:
			return new CmdMath(stream);
		case CT_NUMERIC:
			return new CmdNumeric(stream);
		case CT_RETURN:
			return new CmdReturn(stream);
		case CT_UNARY:
			return new CmdUnary(stream);
		case CT_VARIABLE:
			return new CmdVariable(stream);
		case CT_WHILE:
			return new CmdWhile(stream);
		case CT_GLOBAL_FUNCTION:
			return new CmdGlobalFunction(stream);
		default:
			throw std::runtime_error("Not supported command type in ScriptLoader::loadCommand!");
	}
}